

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genbrk.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int32_t iVar2;
  uint32_t uVar3;
  FILE *pFVar4;
  size_t __n;
  char *pcVar5;
  size_t sVar6;
  UConverter *cnv;
  undefined4 extraout_var;
  UChar *dest;
  RuleBasedBreakIterator *this;
  undefined4 extraout_var_00;
  UNewDataMemory *pData;
  undefined8 extraout_RAX;
  char *pcVar7;
  size_t size;
  UErrorCode UVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  char *unaff_R13;
  char *pcVar12;
  UErrorCode status;
  uint32_t outDataSize;
  int32_t signatureLength;
  UnicodeString ruleSourceS;
  UParseError parseError;
  UErrorCode local_104;
  uint32_t local_100;
  int local_fc;
  char *local_f8;
  ConstChar16Ptr local_f0;
  undefined8 local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  UChar *local_c8;
  UnicodeString local_b8;
  UParseError local_78;
  
  local_104 = U_ZERO_ERROR;
  progName = *argv;
  iVar1 = u_parseArgs(argc,argv,9,options);
  pcVar12 = options[4].value;
  pcVar5 = options[3].value;
  if (iVar1 < 0) {
    main_cold_10();
LAB_00151b81:
    usageAndDie(0);
LAB_00151b88:
    main_cold_1();
LAB_00151b8d:
    main_cold_2();
LAB_00151b95:
    main_cold_9();
  }
  else {
    if (options[1].doesOccur != '\0' || options[0].doesOccur != '\0') goto LAB_00151b81;
    if ((options[3].doesOccur == '\0') || (options[4].doesOccur == '\0')) goto LAB_00151b88;
    if (options[5].doesOccur != '\0') {
      u_setDataDirectory_63(options[5].value);
    }
    local_104 = U_ZERO_ERROR;
    pcVar10 = (char *)0x0;
    if (options[6].doesOccur != '\0') {
      pcVar10 = options[6].value;
    }
    pcVar7 = 
    " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
    ;
    if (options[7].doesOccur == '\0') {
      pcVar7 = (char *)0x0;
    }
    u_init_63(&local_104);
    unaff_R13 = pcVar5;
    if (U_ZERO_ERROR < local_104) goto LAB_00151b8d;
    local_104 = U_ZERO_ERROR;
    local_e0 = pcVar7;
    local_d8 = pcVar10;
    pFVar4 = fopen(pcVar5,"rb");
    if (pFVar4 == (FILE *)0x0) goto LAB_00151b95;
    fseek(pFVar4,0,2);
    __n = ftell(pFVar4);
    fseek(pFVar4,0,0);
    uVar9 = 0xffffffffffffffff;
    if (-0xb < (long)__n) {
      uVar9 = __n + 10;
    }
    pcVar5 = (char *)operator_new__(uVar9);
    sVar6 = fread(pcVar5,1,__n,pFVar4);
    if (sVar6 == __n) {
      local_d0 = pcVar12;
      pcVar5[__n] = '\0';
      fclose(pFVar4);
      local_f8 = pcVar5;
      pcVar5 = ucnv_detectUnicodeSignature_63(pcVar5,(int)__n,&local_fc,&local_104);
      UVar8 = local_104;
      if (U_ZERO_ERROR < local_104) goto LAB_00151ba5;
      lVar11 = (long)local_fc;
      if (pcVar5 == (char *)0x0) {
        lVar11 = 0;
      }
      cnv = ucnv_open_63(pcVar5,&local_104);
      if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar12 = local_f8 + lVar11;
        if (pcVar5 == (char *)0x0) {
          local_fc = 0;
        }
        iVar1 = (int)__n - local_fc;
        iVar2 = ucnv_toUChars_63(cnv,(UChar *)0x0,0,pcVar12,iVar1,&local_104);
        UVar8 = local_104;
        if (local_104 != U_BUFFER_OVERFLOW_ERROR) goto LAB_00151bb4;
        local_104 = U_ZERO_ERROR;
        local_e8 = CONCAT44(extraout_var,iVar2);
        dest = (UChar *)operator_new__((ulong)(iVar2 + 1U) * 2);
        ucnv_toUChars_63(cnv,dest,iVar2 + 1U,pcVar12,iVar1,&local_104);
        UVar8 = local_104;
        if (U_ZERO_ERROR < local_104) goto LAB_00151bbe;
        ucnv_close_63(cnv);
        size = 0;
        local_f0.p_ = dest;
        icu_63::UnicodeString::UnicodeString(&local_b8,'\0',&local_f0,(int32_t)local_e8);
        pcVar5 = local_d0;
        local_c8 = local_f0.p_;
        local_78.line = 0;
        local_78.offset = 0;
        this = (RuleBasedBreakIterator *)icu_63::UMemory::operator_new((UMemory *)0x280,size);
        if (this == (RuleBasedBreakIterator *)0x0) {
          this = (RuleBasedBreakIterator *)0x0;
        }
        else {
          icu_63::RuleBasedBreakIterator::RuleBasedBreakIterator
                    (this,&local_b8,&local_78,&local_104);
        }
        UVar8 = local_104;
        if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
          iVar1 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[0x19])(this);
          dh.info.formatVersion = *(uint8_t (*) [4])((long)CONCAT44(extraout_var_00,iVar1) + 4);
          pData = udata_create(local_d8,(char *)0x0,pcVar5,&dh.info,local_e0,&local_104);
          pFVar4 = _stderr;
          if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
            udata_writeBlock(pData,(void *)CONCAT44(extraout_var_00,iVar1),local_100);
            uVar3 = udata_finish(pData,&local_104);
            if (local_104 < U_ILLEGAL_ARGUMENT_ERROR) {
              if (uVar3 == local_100) {
                (*(this->super_BreakIterator).super_UObject._vptr_UObject[1])(this);
                operator_delete__(dest);
                operator_delete__(local_f8);
                u_cleanup_63();
                if (options[8].doesOccur == '\0') {
                  puts("genbrk: tool completed successfully.");
                }
                icu_63::UnicodeString::~UnicodeString(&local_b8);
                return 0;
              }
            }
            else {
              main_cold_7();
            }
            main_cold_8();
            icu_63::UnicodeString::~UnicodeString(&local_b8);
            _Unwind_Resume(extraout_RAX);
          }
          pcVar12 = u_errorName_63(local_104);
          fprintf(pFVar4,"genbrk: Could not open output file \"%s\", \"%s\"\n",pcVar5,pcVar12);
          goto LAB_00151c22;
        }
      }
      else {
        UVar8 = local_104;
        main_cold_4();
LAB_00151bb4:
        main_cold_5();
LAB_00151bbe:
        main_cold_6();
      }
      pFVar4 = _stderr;
      pcVar5 = u_errorName_63(UVar8);
      fprintf(pFVar4,"createRuleBasedBreakIterator: ICU Error \"%s\"  at line %d, column %d\n",
              pcVar5,local_78._0_8_ & 0xffffffff,(ulong)local_78._0_8_ >> 0x20);
LAB_00151c22:
      exit(local_104);
    }
  }
  UVar8 = (UErrorCode)unaff_R13;
  main_cold_3();
LAB_00151ba5:
  exit(UVar8);
}

Assistant:

int  main(int argc, char **argv) {
    UErrorCode  status = U_ZERO_ERROR;
    const char *ruleFileName;
    const char *outFileName;
    const char *outDir = NULL;
    const char *copyright = NULL;

    //
    // Pick up and check the command line arguments,
    //    using the standard ICU tool utils option handling.
    //
    U_MAIN_INIT_ARGS(argc, argv);
    progName = argv[0];
    argc=u_parseArgs(argc, argv, UPRV_LENGTHOF(options), options);
    if(argc<0) {
        // Unrecognized option
        fprintf(stderr, "error in command line argument \"%s\"\n", argv[-argc]);
        usageAndDie(U_ILLEGAL_ARGUMENT_ERROR);
    }

    if(options[0].doesOccur || options[1].doesOccur) {
        //  -? or -h for help.
        usageAndDie(0);
    }

    if (!(options[3].doesOccur && options[4].doesOccur)) {
        fprintf(stderr, "rule file and output file must both be specified.\n");
        usageAndDie(U_ILLEGAL_ARGUMENT_ERROR);
    }
    ruleFileName = options[3].value;
    outFileName  = options[4].value;

    if (options[5].doesOccur) {
        u_setDataDirectory(options[5].value);
    }

    status = U_ZERO_ERROR;

    /* Combine the directory with the file name */
    if(options[6].doesOccur) {
        outDir = options[6].value;
    }
    if (options[7].doesOccur) {
        copyright = U_COPYRIGHT_STRING;
    }

#if UCONFIG_NO_BREAK_ITERATION || UCONFIG_NO_FILE_IO

    UNewDataMemory *pData;
    char msg[1024];

    /* write message with just the name */
    sprintf(msg, "genbrk writes dummy %s because of UCONFIG_NO_BREAK_ITERATION and/or UCONFIG_NO_FILE_IO, see uconfig.h", outFileName);
    fprintf(stderr, "%s\n", msg);

    /* write the dummy data file */
    pData = udata_create(outDir, NULL, outFileName, &dummyDataInfo, NULL, &status);
    udata_writeBlock(pData, msg, strlen(msg));
    udata_finish(pData, &status);
    return (int)status;

#else
    /* Initialize ICU */
    u_init(&status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "%s: can not initialize ICU.  status = %s\n",
            argv[0], u_errorName(status));
        exit(1);
    }
    status = U_ZERO_ERROR;

    //
    //  Read in the rule source file
    //
    long        result;
    long        ruleFileSize;
    FILE        *file;
    char        *ruleBufferC;

    file = fopen(ruleFileName, "rb");
    if( file == 0 ) {
        fprintf(stderr, "Could not open file \"%s\"\n", ruleFileName);
        exit(-1);
    }
    fseek(file, 0, SEEK_END);
    ruleFileSize = ftell(file);
    fseek(file, 0, SEEK_SET);
    ruleBufferC = new char[ruleFileSize+10];

    result = (long)fread(ruleBufferC, 1, ruleFileSize, file);
    if (result != ruleFileSize)  {
        fprintf(stderr, "Error reading file \"%s\"\n", ruleFileName);
        exit (-1);
    }
    ruleBufferC[ruleFileSize]=0;
    fclose(file);

    //
    // Look for a Unicode Signature (BOM) on the rule file
    //
    int32_t        signatureLength;
    const char *   ruleSourceC = ruleBufferC;
    const char*    encoding = ucnv_detectUnicodeSignature(
                           ruleSourceC, ruleFileSize, &signatureLength, &status);
    if (U_FAILURE(status)) {
        exit(status);
    }
    if(encoding!=NULL ){
        ruleSourceC  += signatureLength;
        ruleFileSize -= signatureLength;
    }

    //
    // Open a converter to take the rule file to UTF-16
    //
    UConverter* conv;
    conv = ucnv_open(encoding, &status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "ucnv_open: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    }

    //
    // Convert the rules to UChar.
    //  Preflight first to determine required buffer size.
    //
    uint32_t destCap = ucnv_toUChars(conv,
                       NULL,           //  dest,
                       0,              //  destCapacity,
                       ruleSourceC,
                       ruleFileSize,
                       &status);
    if (status != U_BUFFER_OVERFLOW_ERROR) {
        fprintf(stderr, "ucnv_toUChars: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    };

    status = U_ZERO_ERROR;
    UChar *ruleSourceU = new UChar[destCap+1];
    ucnv_toUChars(conv,
                  ruleSourceU,     //  dest,
                  destCap+1,
                  ruleSourceC,
                  ruleFileSize,
                  &status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "ucnv_toUChars: ICU Error \"%s\"\n", u_errorName(status));
        exit(status);
    };
    ucnv_close(conv);


    //
    //  Put the source rules into a UnicodeString
    //
    UnicodeString ruleSourceS(FALSE, ruleSourceU, destCap);

    //
    //  Create the break iterator from the rules
    //     This will compile the rules.
    //
    UParseError parseError;
    parseError.line = 0;
    parseError.offset = 0;
    RuleBasedBreakIterator *bi = new RuleBasedBreakIterator(ruleSourceS, parseError, status);
    if (U_FAILURE(status)) {
        fprintf(stderr, "createRuleBasedBreakIterator: ICU Error \"%s\"  at line %d, column %d\n",
                u_errorName(status), (int)parseError.line, (int)parseError.offset);
        exit(status);
    };


    //
    //  Get the compiled rule data from the break iterator.
    //
    uint32_t        outDataSize;
    const uint8_t  *outData;
    outData = bi->getBinaryRules(outDataSize);

    // Copy the data format version numbers from the RBBI data header into the UDataMemory header.
    uprv_memcpy(dh.info.formatVersion, ((RBBIDataHeader *)outData)->fFormatVersion, sizeof(dh.info.formatVersion));

    //
    //  Create the output file
    //
    size_t bytesWritten;
    UNewDataMemory *pData;
    pData = udata_create(outDir, NULL, outFileName, &(dh.info), copyright, &status);
    if(U_FAILURE(status)) {
        fprintf(stderr, "genbrk: Could not open output file \"%s\", \"%s\"\n", 
                         outFileName, u_errorName(status));
        exit(status);
    }


    //  Write the data itself.
    udata_writeBlock(pData, outData, outDataSize);
    // finish up 
    bytesWritten = udata_finish(pData, &status);
    if(U_FAILURE(status)) {
        fprintf(stderr, "genbrk: error %d writing the output file\n", status);
        exit(status);
    }
    
    if (bytesWritten != outDataSize) {
        fprintf(stderr, "Error writing to output file \"%s\"\n", outFileName);
        exit(-1);
    }

    delete bi;
    delete[] ruleSourceU;
    delete[] ruleBufferC;
    u_cleanup();


    if(!options[8].doesOccur) {
        printf("genbrk: tool completed successfully.\n");
    }
    return 0;

#endif /* #if !UCONFIG_NO_BREAK_ITERATION */
}